

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<2048u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<2048u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  uint *puVar1;
  uint *puVar2;
  int *piVar3;
  unsigned_fast_type i;
  long lVar4;
  byte bVar5;
  sbyte sVar6;
  void *in_RCX;
  uint uVar9;
  ulong uVar7;
  byte bVar8;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  result_type range;
  uintwide_t<24U,_unsigned_char,_void,_false> result_max;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_428;
  uintwide_t<2048U,_unsigned_int,_void,_false> local_328;
  uint local_228 [64];
  uint local_128 [64];
  
  uVar10 = 0;
  memset(this,0,0x100);
  uVar9._0_3_ = input_params->param_a;
  uVar9._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  bVar8 = 1;
  lVar4 = 0;
  do {
    bVar5 = bVar8 - 1 & 3;
    if (bVar5 == 0) {
      uVar11 = (uVar9 % 0xadc8) * 0xbc8f;
      uVar10 = (uVar9 / 0xadc8) * 0xd47;
      uVar9 = (uVar9 / 0xadc8) * -0xd47;
      if (uVar11 < uVar10) {
        uVar9 = uVar10 ^ 0x7fffffff;
      }
      uVar9 = uVar9 + uVar11;
      *(uint *)input_params = uVar9;
      uVar10 = uVar9;
    }
    sVar6 = bVar5 << 3;
    *(uint *)(this + lVar4) = *(uint *)(this + lVar4) | (uVar10 >> sVar6 & 0xff) << sVar6;
    lVar4 = lVar4 + (ulong)((bVar8 & 3) == 0) * 4;
    bVar8 = bVar8 + 1;
  } while (lVar4 != 0x100);
  memcpy(&local_428,in_RCX,0x100);
  memset(&local_328,0,0x100);
  lVar4 = 0xfc;
  do {
    bVar8 = 0;
    if (lVar4 == -4) break;
    uVar9 = *(uint *)((long)local_428.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    uVar10 = *(uint *)((long)local_328.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    bVar8 = -(uVar9 <= uVar10) | 1;
    lVar4 = lVar4 + -4;
  } while (uVar9 == uVar10);
  if (bVar8 == 0) {
    memcpy(local_228,(void *)((long)in_RCX + 0x100),0x100);
    memset(local_128,0,0x100);
    memset(local_128,0xff,0x100);
    lVar4 = 0xfc;
    do {
      bVar8 = 0;
      if (lVar4 == -4) break;
      puVar1 = (uint *)((long)local_228 + lVar4);
      puVar2 = (uint *)((long)local_128 + lVar4);
      bVar8 = -(*puVar1 <= *puVar2) | 1;
      lVar4 = lVar4 + -4;
    } while (*puVar1 == *puVar2);
    if (bVar8 == 0) goto LAB_001548cc;
  }
  memcpy(&local_428,(void *)((long)in_RCX + 0x100),0x100);
  memcpy(local_228,in_RCX,0x100);
  lVar4 = 0;
  bVar12 = false;
  do {
    uVar7 = ((ulong)local_428.values.super_array<unsigned_int,_64UL>.elems[lVar4] - (ulong)bVar12) -
            (ulong)local_228[lVar4];
    local_428.values.super_array<unsigned_int,_64UL>.elems[lVar4] = (value_type_conflict)uVar7;
    bVar12 = uVar7 >> 0x20 != 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  memcpy((uniform_int_distribution<2048u,unsigned_int,void,false> *)&local_328,&local_428,0x100);
  lVar4 = 0;
  do {
    piVar3 = (int *)((long)local_328.values.super_array<unsigned_int,_64UL>.elems + lVar4);
    *piVar3 = *piVar3 + 1;
    if (*piVar3 != 0) break;
    bVar12 = lVar4 != 0xfc;
    lVar4 = lVar4 + 4;
  } while (bVar12);
  if ((uniform_int_distribution<2048u,unsigned_int,void,false> *)&local_328 == this) {
    memset(this,0,0x100);
  }
  else {
    memset(&local_428,0,0x100);
    uintwide_t<2048U,_unsigned_int,_void,_false>::eval_divide_knuth
              ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_328,&local_428);
    memcpy(this,&local_428,0x100);
  }
  memcpy(&local_428,in_RCX,0x100);
  uintwide_t<2048U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<2048U,_unsigned_int,_void,_false> *)this,&local_428);
LAB_001548cc:
  return (result_type)SUB83(this,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }